

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O2

QDebug operator<<(QDebug s,QNetworkCookie *cookie)

{
  long lVar1;
  QNetworkCookiePrivate *pQVar2;
  long *plVar3;
  QDebug *pQVar4;
  QNetworkCookie *in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_58;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)cookie);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)cookie,"QNetworkCookie(");
  QNetworkCookie::toRawForm((QByteArray *)&QStack_58,in_RDX,Full);
  pQVar4 = QDebug::operator<<(pQVar4,(QByteArray *)&QStack_58);
  QDebug::operator<<(pQVar4,')');
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
  pQVar2 = (cookie->d).d.ptr;
  (cookie->d).d.ptr = (QNetworkCookiePrivate *)0x0;
  *(QNetworkCookiePrivate **)s.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)s.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug s, const QNetworkCookie &cookie)
{
    QDebugStateSaver saver(s);
    s.resetFormat().nospace();
    s << "QNetworkCookie(" << cookie.toRawForm(QNetworkCookie::Full) << ')';
    return s;
}